

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.h
# Opt level: O2

Stats * __thiscall SpecificStrategy::Stats::operator+=(Stats *this,Stats *stats)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  iVar5 = (stats->blocks).perfect;
  iVar6 = (stats->blocks).conflict;
  iVar7 = stats->phantoms;
  iVar8 = (this->blocks).perfect;
  iVar9 = (this->blocks).conflict;
  iVar10 = this->phantoms;
  iVar11 = (this->edges).internal.perfect;
  iVar12 = (this->edges).internal.conflict;
  iVar13 = (this->edges).external.perfect;
  iVar14 = (this->edges).external.conflict;
  this->instrs = this->instrs + stats->instrs;
  (this->blocks).perfect = iVar8 + iVar5;
  (this->blocks).conflict = iVar9 + iVar6;
  this->phantoms = iVar10 + iVar7;
  iVar5 = (stats->edges).internal.conflict;
  iVar6 = (stats->edges).external.perfect;
  iVar7 = (stats->edges).external.conflict;
  (this->edges).internal.perfect = (stats->edges).internal.perfect + iVar11;
  (this->edges).internal.conflict = iVar5 + iVar12;
  (this->edges).external.perfect = iVar6 + iVar13;
  (this->edges).external.conflict = iVar7 + iVar14;
  uVar1 = stats->calls;
  uVar3 = stats->indirects;
  uVar2 = this->calls;
  uVar4 = this->indirects;
  this->calls = uVar2 + uVar1;
  this->indirects = uVar4 + uVar3;
  return this;
}

Assistant:

Stats& operator+=(const Stats& stats) {
			instrs += stats.instrs;
			blocks.perfect += stats.blocks.perfect;
			blocks.conflict += stats.blocks.conflict;
			phantoms += stats.phantoms;
			edges.internal.perfect += stats.edges.internal.perfect;
			edges.internal.conflict += stats.edges.internal.conflict;
			edges.external.perfect += stats.edges.external.perfect;
			edges.external.conflict += stats.edges.external.conflict;
			calls += stats.calls;
			indirects += stats.indirects;

			return *this;
		}